

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separator.cpp
# Opt level: O0

void __thiscall ftxui::SeparatorWithPixel::Render(SeparatorWithPixel *this,Screen *screen)

{
  Pixel *this_00;
  int local_20;
  int local_1c;
  int x;
  int y;
  Screen *screen_local;
  SeparatorWithPixel *this_local;
  
  for (local_1c = (this->super_Separator).super_Node.box_.y_min;
      local_1c <= (this->super_Separator).super_Node.box_.y_max; local_1c = local_1c + 1) {
    for (local_20 = (this->super_Separator).super_Node.box_.x_min;
        local_20 <= (this->super_Separator).super_Node.box_.x_max; local_20 = local_20 + 1) {
      this_00 = Screen::PixelAt(screen,local_20,local_1c);
      Pixel::operator=(this_00,&this->pixel_);
    }
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    for (int y = box_.y_min; y <= box_.y_max; ++y) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, y) = pixel_;
      }
    }
  }